

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void default_skip_mask(mode_skip_mask_t *mask,REF_SET ref_set)

{
  int in_ESI;
  void *in_RDI;
  MV_REFERENCE_FRAME *this_combo;
  int i;
  int num_ref_combos;
  MV_REFERENCE_FRAME (*ref_set_combos) [2];
  MV_REFERENCE_FRAME ref2;
  MV_REFERENCE_FRAME ref1;
  int local_20;
  int local_1c;
  MV_REFERENCE_FRAME (*local_18) [2];
  char local_e;
  char local_d;
  
  if (in_ESI == 0) {
    memset(in_RDI,0,0x68);
  }
  else {
    memset(in_RDI,0,0x20);
    for (local_d = '\0'; local_d < '\b'; local_d = local_d + '\x01') {
      for (local_e = -1; local_e < '\b'; local_e = local_e + '\x01') {
        *(undefined1 *)((long)in_RDI + (long)(local_e + 1) + (long)local_d * 9 + 0x20) = 1;
      }
    }
    if (in_ESI == 1) {
      local_18 = reduced_ref_combos;
      local_1c = 0x10;
    }
    else if (in_ESI == 2) {
      local_18 = real_time_ref_combos;
      local_1c = 4;
    }
    else {
      local_1c = 0;
    }
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      *(undefined1 *)
       ((long)in_RDI + (long)(local_18[local_20][1] + 1) + (long)local_18[local_20][0] * 9 + 0x20) =
           0;
    }
  }
  return;
}

Assistant:

static inline void default_skip_mask(mode_skip_mask_t *mask, REF_SET ref_set) {
  if (ref_set == REF_SET_FULL) {
    // Everything available by default.
    memset(mask, 0, sizeof(*mask));
  } else {
    // All modes available by default.
    memset(mask->pred_modes, 0, sizeof(mask->pred_modes));
    // All references disabled first.
    for (MV_REFERENCE_FRAME ref1 = INTRA_FRAME; ref1 < REF_FRAMES; ++ref1) {
      for (MV_REFERENCE_FRAME ref2 = NONE_FRAME; ref2 < REF_FRAMES; ++ref2) {
        mask->ref_combo[ref1][ref2 + 1] = true;
      }
    }
    const MV_REFERENCE_FRAME(*ref_set_combos)[2];
    int num_ref_combos;

    // Then enable reduced set of references explicitly.
    switch (ref_set) {
      case REF_SET_REDUCED:
        ref_set_combos = reduced_ref_combos;
        num_ref_combos =
            (int)sizeof(reduced_ref_combos) / sizeof(reduced_ref_combos[0]);
        break;
      case REF_SET_REALTIME:
        ref_set_combos = real_time_ref_combos;
        num_ref_combos =
            (int)sizeof(real_time_ref_combos) / sizeof(real_time_ref_combos[0]);
        break;
      default: assert(0); num_ref_combos = 0;
    }

    for (int i = 0; i < num_ref_combos; ++i) {
      const MV_REFERENCE_FRAME *const this_combo = ref_set_combos[i];
      mask->ref_combo[this_combo[0]][this_combo[1] + 1] = false;
    }
  }
}